

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O3

bool __thiscall
duckdb::PerfectHashJoinExecutor::BuildPerfectHashTable
          (PerfectHashJoinExecutor *this,LogicalType *key_type)

{
  pointer pLVar1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  bool bVar3;
  _Head_base<0UL,_bool_*,_false> __s;
  LogicalType *type;
  pointer __args;
  ulong __n;
  idx_t build_size;
  ulong local_38;
  
  local_38 = (this->perfect_join_statistics).build_range + 1;
  __args = (this->join->rhs_output_columns).col_types.
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar1 = *(pointer *)
            ((long)&(this->join->rhs_output_columns).col_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if (__args != pLVar1) {
    do {
      ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::
      emplace_back<duckdb::LogicalType_const&,unsigned_long&>
                ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&this->perfect_hash_table,
                 __args,&local_38);
      __args = __args + 1;
    } while (__args != pLVar1);
  }
  __n = local_38;
  __s._M_head_impl = (bool *)operator_new__(local_38);
  _Var2._M_head_impl =
       (this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  (this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = __s._M_head_impl;
  if (_Var2._M_head_impl != (bool *)0x0) {
    operator_delete__(_Var2._M_head_impl);
    __s._M_head_impl =
         (this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    __n = local_38;
  }
  switchD_012e3010::default(__s._M_head_impl,0,__n);
  bVar3 = FullScanHashTable(this,key_type);
  return bVar3;
}

Assistant:

bool PerfectHashJoinExecutor::BuildPerfectHashTable(LogicalType &key_type) {
	// First, allocate memory for each build column
	auto build_size = perfect_join_statistics.build_range + 1;
	for (const auto &type : join.rhs_output_columns.col_types) {
		perfect_hash_table.emplace_back(type, build_size);
	}

	// and for duplicate_checking
	bitmap_build_idx = make_unsafe_uniq_array_uninitialized<bool>(build_size);
	memset(bitmap_build_idx.get(), 0, sizeof(bool) * build_size); // set false

	// Now fill columns with build data
	return FullScanHashTable(key_type);
}